

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O1

int faup_snapshot_file_zip(char *dirpath)

{
  int iVar1;
  mz_bool mVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t __size;
  size_t sVar4;
  FILE *unaff_RBP;
  void *unaff_R13;
  char *zip_filename;
  char *full_file_path;
  stat_conflict zipstats;
  char *local_d0;
  char *local_c8;
  stat local_c0;
  
  __dirp = opendir(dirpath);
  if (__dirp == (DIR *)0x0) {
    faup_snapshot_file_zip_cold_8();
  }
  else {
    iVar1 = asprintf(&local_d0,"%s.urls",dirpath);
    if (iVar1 < 0) {
      faup_snapshot_file_zip_cold_7();
    }
    else {
      iVar1 = stat(local_d0,&local_c0);
      if (iVar1 != 0) {
        pdVar3 = readdir(__dirp);
        if (pdVar3 != (dirent *)0x0) {
          do {
            if (pdVar3->d_name[0] == '.') {
LAB_00118886:
              iVar1 = 2;
            }
            else {
              iVar1 = asprintf(&local_c8,"%s%c%s",dirpath,0x2f);
              if (iVar1 < 0) {
                faup_snapshot_file_zip_cold_5();
                goto LAB_00118886;
              }
              unaff_RBP = fopen(local_c8,"rb");
              if (unaff_RBP == (FILE *)0x0) {
                faup_snapshot_file_zip_cold_4();
                iVar1 = 1;
                unaff_RBP = (FILE *)0x0;
              }
              else {
                fseek(unaff_RBP,0,2);
                __size = ftell(unaff_RBP);
                fseek(unaff_RBP,0,0);
                unaff_R13 = malloc(__size + 1);
                if (unaff_R13 == (void *)0x0) {
                  faup_snapshot_file_zip_cold_3();
                  iVar1 = 4;
                  unaff_R13 = (void *)0x0;
                }
                else {
                  sVar4 = fread(unaff_R13,__size,1,unaff_RBP);
                  if (sVar4 == 0) {
                    faup_snapshot_file_zip_cold_2();
                  }
                  else {
                    mVar2 = mz_zip_add_mem_to_archive_file_in_place
                                      (local_d0,local_c8,unaff_R13,__size,(void *)0x0,0,9);
                    if (mVar2 != 0) {
                      fclose(unaff_RBP);
                      free(unaff_R13);
                      free(local_c8);
                      iVar1 = 0;
                      goto LAB_00118970;
                    }
                    faup_snapshot_file_zip_cold_1();
                  }
                  iVar1 = 4;
                }
              }
            }
LAB_00118970:
            if ((iVar1 != 0) && (iVar1 != 2)) {
              if (iVar1 != 4) {
                return -1;
              }
              fclose(unaff_RBP);
              free(unaff_R13);
              return -1;
            }
            pdVar3 = readdir(__dirp);
          } while (pdVar3 != (dirent *)0x0);
        }
        free(local_d0);
        closedir(__dirp);
        return 0;
      }
      faup_snapshot_file_zip_cold_6();
    }
  }
  return -1;
}

Assistant:

int faup_snapshot_file_zip(char *dirpath)
{
  DIR *dir;
  struct dirent *ent;
  FILE *fp;

  char *zip_filename;
  long file_size;
  void *file_content;

  mz_bool status;
  mz_zip_archive zip_archive;

  struct stat zipstats;
  int retval;

  dir = opendir(dirpath);
  if (!dir) {
    fprintf(stderr, "Error reading directory '%s': %s\n", dirpath, strerror(errno));
    return -1;
  }

  retval = asprintf(&zip_filename, "%s.urls", dirpath);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot urls with dirpath!\n");
    return -1;
  }
  
  retval = stat(zip_filename, &zipstats);
  if (retval == 0) {
    fprintf(stderr, "The snapshot %s already exists!\n", zip_filename);
    free(zip_filename);
    closedir(dir);
    return -1;
  }

  while ((ent = readdir(dir)) != NULL) {
      char *full_file_path;
      int retval;
      size_t readval;

      if (ent->d_name[0] == '.') { continue; }

      retval = asprintf(&full_file_path, "%s%c%s", dirpath, FAUP_OS_DIRSEP_C, ent->d_name);
      if (retval < 0) {
	fprintf(stderr, "Error: cannot concatenate filename with dirpath!\n");
	continue;
      }
      
      fp = fopen(full_file_path, "rb");
      if (!fp) {
	fprintf(stderr, "Cannot open file %s for reading!\n", full_file_path);
	free(full_file_path);
	return -1;
      }
      fseek(fp, 0, SEEK_END);
      file_size = ftell(fp);
      fseek(fp, 0, SEEK_SET);
      
      file_content = malloc(file_size + 1);
      if (!file_content) {
	fprintf(stderr, "Cannot allocate the file size content:%lu", file_size);
	free(full_file_path);
	goto err;
      }

      readval = fread(file_content, file_size, 1, fp);
      if (readval == 0) {
	fprintf(stderr, "Error reading file %s\n", full_file_path);
	free(full_file_path);
	goto err;
      }
      status = mz_zip_add_mem_to_archive_file_in_place(zip_filename, full_file_path, file_content, file_size, NULL, 0, MZ_BEST_COMPRESSION);
      if (!status) {
      	fprintf(stderr, "Cannot create %s!\n", full_file_path);
	free(full_file_path);
	goto err;
      }

      /* printf("file name:%s\n", full_file_path); */
      
      fclose(fp);
      free(file_content);
      free(full_file_path);
  }

  free(zip_filename);

  closedir(dir);
  
  return 0;

 err:
  fclose(fp);
  free(file_content);
  return -1;
}